

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.h
# Opt level: O2

string * __thiscall google::protobuf::Enum::_internal_mutable_name_abi_cxx11_(Enum *this)

{
  string *psVar1;
  Arena *arena;
  
  arena = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  psVar1 = internal::ArenaStringPtr::Mutable
                     (&this->name_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,arena)
  ;
  return psVar1;
}

Assistant:

inline std::string* Enum::_internal_mutable_name() {
  
  return name_.Mutable(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
}